

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

double sampleSurfaceNoise(SurfaceNoise *sn,int x,int y,int z)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double d3;
  double dVar9;
  double dVar10;
  double dVar11;
  double yamp;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar5 = sn->xzScale * 684.412;
  dVar3 = sn->yScale * 684.412;
  dVar6 = dVar5 / sn->xzFactor;
  dVar9 = dVar3 / sn->yFactor;
  dVar15 = (double)y;
  dVar13 = 1.0;
  dVar14 = 1.0;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar10 = 0.0;
  lVar1 = 0;
  for (uVar2 = 0; uVar2 != 0x10; uVar2 = uVar2 + 1) {
    dVar7 = dVar5 * (double)x * dVar14;
    dVar8 = dVar3 * dVar15 * dVar14;
    d3 = dVar5 * (double)z * dVar14;
    yamp = dVar3 * dVar14;
    dVar4 = samplePerlin((PerlinNoise *)(((sn->octmin).octaves)->d + lVar1),dVar7,dVar8,d3,yamp,
                         yamp * dVar15);
    dVar7 = samplePerlin((PerlinNoise *)(((sn->octmax).octaves)->d + lVar1),dVar7,dVar8,d3,yamp,
                         yamp * dVar15);
    if (uVar2 < 8) {
      dVar8 = dVar14 * dVar9;
      dVar8 = samplePerlin((PerlinNoise *)(((sn->octmain).octaves)->d + lVar1),
                           (double)x * dVar6 * dVar14,dVar9 * dVar15 * dVar14,
                           dVar6 * (double)z * dVar14,dVar8,dVar8 * dVar15);
      dVar10 = dVar10 + dVar8 * dVar13;
    }
    dVar11 = dVar11 + dVar13 * dVar4;
    dVar12 = dVar12 + dVar13 * dVar7;
    dVar13 = dVar13 * 2.0;
    dVar14 = dVar14 * 0.5;
    lVar1 = lVar1 + 0x140;
  }
  dVar14 = dVar10 * 0.05 + 0.5;
  dVar11 = dVar11 * 0.001953125;
  dVar13 = dVar11;
  if ((0.0 < dVar14) && (dVar13 = dVar12 * 0.001953125, dVar14 < 1.0)) {
    dVar13 = dVar14 * (dVar13 - dVar11) + dVar11;
  }
  return dVar13;
}

Assistant:

double sampleSurfaceNoise(const SurfaceNoise *sn, int x, int y, int z)
{
    double xzScale = 684.412 * sn->xzScale;
    double yScale = 684.412 * sn->yScale;
    double xzStep = xzScale / sn->xzFactor;
    double yStep = yScale / sn->yFactor;

    double minNoise = 0;
    double maxNoise = 0;
    double mainNoise = 0;
    double persist = 1.0;
    double contrib = 1.0;
    double dx, dy, dz, sy, ty;
    int i;

    for (i = 0; i < 16; i++)
    {
        dx = maintainPrecision(x * xzScale * persist);
        dy = maintainPrecision(y * yScale  * persist);
        dz = maintainPrecision(z * xzScale * persist);
        sy = yScale * persist;
        ty = y * sy;

        minNoise += samplePerlin(&sn->octmin.octaves[i], dx, dy, dz, sy, ty) * contrib;
        maxNoise += samplePerlin(&sn->octmax.octaves[i], dx, dy, dz, sy, ty) * contrib;

        if (i < 8)
        {
            dx = maintainPrecision(x * xzStep * persist);
            dy = maintainPrecision(y * yStep  * persist);
            dz = maintainPrecision(z * xzStep * persist);
            sy = yStep * persist;
            ty = y * sy;
            mainNoise += samplePerlin(&sn->octmain.octaves[i], dx, dy, dz, sy, ty) * contrib;
        }
        persist *= 0.5;
        contrib *= 2.0;
    }

    return clampedLerp(0.5 + 0.05*mainNoise, minNoise/512.0, maxNoise/512.0);
}